

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::MaybeLogToEmail(LogSeverity severity,char *message,size_t len)

{
  char *__rhs;
  undefined1 local_c8 [8];
  string subject;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string to;
  string body;
  
  if ((email_logging_severity_ <= severity) || (fLI::FLAGS_logemaillevel <= severity)) {
    std::__cxx11::string::string((string *)local_68,fLS::FLAGS_alsologtoemail_abi_cxx11_);
    if (addresses__abi_cxx11_._8_8_ != 0) {
      if (to._M_dataplus._M_p != (pointer)0x0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,","
                  );
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 addresses__abi_cxx11_);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"[LOG] ",(allocator<char> *)(body.field_2._M_local_buf + 0xf));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&subject.field_2 + 8),&local_88,
                   *(char **)(LogSeverityNames + (long)severity * 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&to.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&subject.field_2 + 8),": ");
    __rhs = glog_internal_namespace_::ProgramInvocationShortName();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&to.field_2 + 8),__rhs);
    std::__cxx11::string::~string((string *)(to.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(subject.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_88);
    hostname_abi_cxx11_();
    std::__cxx11::string::string
              ((string *)(to.field_2._M_local_buf + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               hostname__abi_cxx11_);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&to.field_2 + 8),"\n\n");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&to.field_2 + 8),message,len);
    SendEmailInternal((char *)local_68,(char *)local_c8,(char *)to.field_2._8_8_,false);
    std::__cxx11::string::~string((string *)(to.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string((string *)local_68);
  }
  return;
}

Assistant:

inline void LogDestination::MaybeLogToEmail(LogSeverity severity,
					    const char* message, size_t len) {
  if (severity >= email_logging_severity_ ||
      severity >= FLAGS_logemaillevel) {
    string to(FLAGS_alsologtoemail);
    if (!addresses_.empty()) {
      if (!to.empty()) {
        to += ",";
      }
      to += addresses_;
    }
    const string subject(string("[LOG] ") + LogSeverityNames[severity] + ": " +
                         glog_internal_namespace_::ProgramInvocationShortName());
    string body(hostname());
    body += "\n\n";
    body.append(message, len);

    // should NOT use SendEmail().  The caller of this function holds the
    // log_mutex and SendEmail() calls LOG/VLOG which will block trying to
    // acquire the log_mutex object.  Use SendEmailInternal() and set
    // use_logging to false.
    SendEmailInternal(to.c_str(), subject.c_str(), body.c_str(), false);
  }
}